

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O2

LLVMDependenceGraph * __thiscall
dg::LLVMDependenceGraph::buildSubgraph(LLVMDependenceGraph *this,LLVMNode *node)

{
  Function *callFunc;
  LLVMDependenceGraph *pLVar1;
  Value *this_00;
  
  this_00 = (node->super_Node<dg::LLVMDependenceGraph,_llvm::Value_*,_dg::LLVMNode>).key;
  if (this_00[0x10] != (Value)0x53) {
    this_00 = (Value *)(CallBase *)0x0;
  }
  callFunc = llvm::CallBase::getCalledFunction((CallBase *)this_00);
  pLVar1 = buildSubgraph(this,node,callFunc,false);
  return pLVar1;
}

Assistant:

LLVMDependenceGraph *LLVMDependenceGraph::buildSubgraph(LLVMNode *node) {
    using namespace llvm;

    Value *val = node->getValue();
    CallInst *CInst = dyn_cast<CallInst>(val);
    assert(CInst && "buildSubgraph called on non-CallInst");
    Function *callFunc = CInst->getCalledFunction();

    return buildSubgraph(node, callFunc);
}